

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O1

void __thiscall
zmq::endpoint_uri_pair_t::endpoint_uri_pair_t
          (endpoint_uri_pair_t *this,string *local,string *remote,endpoint_type_t param_3)

{
  pointer pcVar1;
  
  (this->local)._M_dataplus._M_p = (pointer)&(this->local).field_2;
  pcVar1 = (local->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + local->_M_string_length);
  (this->remote)._M_dataplus._M_p = (pointer)&(this->remote).field_2;
  pcVar1 = (remote->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->remote,pcVar1,pcVar1 + remote->_M_string_length);
  this->local_type = param_3;
  return;
}

Assistant:

endpoint_uri_pair_t (const std::string &local,
                         const std::string &remote,
                         endpoint_type_t local_type) :
        local (local),
        remote (remote),
        local_type (local_type)
    {
    }